

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Obj_t * Abc_NtkTopmost_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int LevelCut)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  int LevelCut_local;
  Abc_Obj_t *pNode_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 == 0) {
    if ((pNode->field_6).pTemp == (void *)0x0) {
      if ((uint)LevelCut < *(uint *)&pNode->field_0x14 >> 0xc) {
        pAVar2 = Abc_ObjFanin0(pNode);
        Abc_NtkTopmost_rec(pNtkNew,pAVar2,LevelCut);
        pAVar2 = Abc_ObjFanin1(pNode);
        Abc_NtkTopmost_rec(pNtkNew,pAVar2,LevelCut);
        pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
        pAVar2 = Abc_ObjChild0Copy(pNode);
        p1 = Abc_ObjChild1Copy(pNode);
        pNtkNew_local = (Abc_Ntk_t *)Abc_AigAnd(pMan,pAVar2,p1);
        (pNode->field_6).pCopy = (Abc_Obj_t *)pNtkNew_local;
      }
      else {
        pNtkNew_local = (Abc_Ntk_t *)Abc_NtkCreatePi(pNtkNew);
        (pNode->field_6).pCopy = (Abc_Obj_t *)pNtkNew_local;
      }
    }
    else {
      pNtkNew_local = (Abc_Ntk_t *)(pNode->field_6).pCopy;
    }
    return (Abc_Obj_t *)pNtkNew_local;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x20f,"Abc_Obj_t *Abc_NtkTopmost_rec(Abc_Ntk_t *, Abc_Obj_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkTopmost_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int LevelCut )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->pCopy )
        return pNode->pCopy;
    if ( pNode->Level <= (unsigned)LevelCut )
        return pNode->pCopy = Abc_NtkCreatePi( pNtkNew );
    Abc_NtkTopmost_rec( pNtkNew, Abc_ObjFanin0(pNode), LevelCut );
    Abc_NtkTopmost_rec( pNtkNew, Abc_ObjFanin1(pNode), LevelCut );
    return pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}